

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suprun.c
# Opt level: O3

void supivoc1(supcxdef *sup,voccxdef *ctx,vocidef *v,objnum target,int inh_from_obj,int flags)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  vocidef *v_00;
  errcxdef *ec;
  mcmcxdef *mctx;
  objnum oVar4;
  int iVar5;
  size_t sVar6;
  vocdef **ppvVar7;
  uint uVar8;
  vocdef *pvVar9;
  uchar *wrd2;
  objnum *poVar10;
  vocwdef *pvVar11;
  char buf [40];
  
  uVar8 = (uint)v->vocinsc;
  if (v->vocinsc != 0) {
    poVar10 = (v->vociu).vocius.vociussc;
    do {
      uVar2 = *poVar10;
      v_00 = ctx->voccxinh[uVar2 >> 8][(byte)uVar2];
      if (v_00 == (vocidef *)0x0) {
        supgnam(buf,sup->supcxtab,uVar2);
        ec = ctx->voccxerr;
        mctx = ctx->voccxmem;
        sVar6 = strlen(buf);
        sup_log_undefobj(mctx,ec,0x40d,buf,(int)sVar6,*poVar10);
      }
      else {
        supivoc1(sup,ctx,v_00,target,0,flags);
        if ((((v_00->vociu).vocius.vociusflg & 1) != 0) && ((v->vociu).vocius.vociusilc == 0xffff))
        {
          oVar4 = (v_00->vociu).vocius.vociusloc;
          if (oVar4 == 0xffff) {
            oVar4 = (v_00->vociu).vocius.vociusilc;
          }
          (v->vociu).vocius.vociusilc = oVar4;
        }
        bVar1 = (v_00->vociu).vocius.vociusflg;
        if ((bVar1 & 2) != 0 && ((bVar1 & 1) != 0 || inh_from_obj != 0)) {
          uVar2 = *poVar10;
          iVar5 = 0x100;
          ppvVar7 = ctx->voccxhsh;
          do {
            for (pvVar9 = *ppvVar7; pvVar9 != (vocdef *)0x0; pvVar9 = pvVar9->vocnxt) {
              uVar3 = pvVar9->vocwlst;
              if ((uVar3 != 0xffffffff) && (ctx->voccxwp[(ulong)uVar3 / 2000] != (vocwdef *)0x0)) {
                pvVar11 = ctx->voccxwp[(ulong)uVar3 / 2000] + uVar3 % 2000;
                do {
                  if (pvVar11->vocwobj == uVar2) {
                    wrd2 = (uchar *)0x0;
                    if (pvVar9->vocln2 != 0) {
                      wrd2 = pvVar9->voctxt + pvVar9->voclen;
                    }
                    vocadd2(ctx,(ushort)pvVar11->vocwtyp,target,flags + 2,pvVar9->voctxt,
                            (uint)pvVar9->voclen,wrd2,(uint)pvVar9->vocln2);
                  }
                  uVar3 = pvVar11->vocwnxt;
                } while ((uVar3 != 0xffffffff) &&
                        (pvVar11 = ctx->voccxwp[(ulong)uVar3 / 2000] + uVar3 % 2000,
                        ctx->voccxwp[(ulong)uVar3 / 2000] != (vocwdef *)0x0));
              }
            }
            ppvVar7 = ppvVar7 + 1;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      }
      poVar10 = poVar10 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

void supivoc1(supcxdef *sup, voccxdef *ctx, vocidef *v, objnum target,
              int inh_from_obj, int flags)
{
    objnum   *sc;
    int       numsc;
    vocidef  *scv;
    
    for (numsc = v->vocinsc, sc = v->vocisc ; numsc ; ++sc, --numsc)
    {
        scv = vocinh(ctx, *sc);
        if (scv)
        {
            /* inherit from its superclasses first */
            supivoc1(sup, ctx, scv, target, FALSE, flags);
            
            /* if it's a class object, we can inherit from it */
            if (scv->vociflg & VOCIFCLASS)
            {
                /* inherit location, if we haven't already done so */
                if (v->vociilc == MCMONINV)
                {
                    if (scv->vociloc == MCMONINV)
                        v->vociilc = scv->vociilc;
                    else
                        v->vociilc = scv->vociloc;
                }
            }

            /*
             *   inherit from superclass if it's a class, or if we're
             *   supposed to inherit from any object 
             */
            if (inh_from_obj || (scv->vociflg & VOCIFCLASS))
            {
                /* inherit vocabulary if this superclass has any words */
                if (scv->vociflg & VOCIFVOC)
                    supiwrds(ctx, *sc, target, flags);
            }
        }
        else
        {
            char  buf[TOKNAMMAX + 1];

            /* get the symbol's name */
            supgnam(buf, sup->supcxtab, *sc);

            /* log an error with the symbol's name and location of first use */
            sup_log_undefobj(ctx->voccxmem, ctx->voccxerr, ERR_UNDFOBJ,
                             buf, (int)strlen(buf), *sc);
        }
    }    
}